

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O3

lyd_diff_op lyd_diff_str2op(char *str)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = *str;
  if (bVar1 < 0x6e) {
    if (bVar1 == 99) {
      iVar2 = strcmp(str,"create");
      if (iVar2 == 0) {
        return LYD_DIFF_OP_CREATE;
      }
      __assert_fail("!strcmp(str, \"create\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x5c,"enum lyd_diff_op lyd_diff_str2op(const char *)");
    }
    if (bVar1 == 100) {
      iVar2 = strcmp(str,"delete");
      if (iVar2 == 0) {
        return LYD_DIFF_OP_DELETE;
      }
      __assert_fail("!strcmp(str, \"delete\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x5f,"enum lyd_diff_op lyd_diff_str2op(const char *)");
    }
  }
  else {
    if (bVar1 == 0x6e) {
      iVar2 = strcmp(str,"none");
      if (iVar2 == 0) {
        return LYD_DIFF_OP_NONE;
      }
      __assert_fail("!strcmp(str, \"none\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x65,"enum lyd_diff_op lyd_diff_str2op(const char *)");
    }
    if (bVar1 == 0x72) {
      iVar2 = strcmp(str,"replace");
      if (iVar2 == 0) {
        return LYD_DIFF_OP_REPLACE;
      }
      __assert_fail("!strcmp(str, \"replace\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x62,"enum lyd_diff_op lyd_diff_str2op(const char *)");
    }
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x69);
  return LYD_DIFF_OP_CREATE;
}

Assistant:

static enum lyd_diff_op
lyd_diff_str2op(const char *str)
{
    switch (str[0]) {
    case 'c':
        assert(!strcmp(str, "create"));
        return LYD_DIFF_OP_CREATE;
    case 'd':
        assert(!strcmp(str, "delete"));
        return LYD_DIFF_OP_DELETE;
    case 'r':
        assert(!strcmp(str, "replace"));
        return LYD_DIFF_OP_REPLACE;
    case 'n':
        assert(!strcmp(str, "none"));
        return LYD_DIFF_OP_NONE;
    }

    LOGINT(NULL);
    return 0;
}